

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_buffer.cc
# Opt level: O1

size_t __thiscall raptor::SliceBuffer::CopyToBuffer(SliceBuffer *this,void *buffer,size_t length)

{
  iterator __position;
  size_t sVar1;
  ulong __n;
  uint8_t *__src;
  void *pvVar2;
  ulong unaff_RBP;
  pointer this_00;
  size_t sVar3;
  Slice SStack_a0;
  Slice SStack_80;
  
  if (length <= this->_length) {
    this_00 = (this->_vs).super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
              super__Vector_impl_data._M_start;
    sVar3 = 0;
    if (length != 0 &&
        this_00 !=
        (this->_vs).super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        sVar1 = Slice::size(this_00);
        __n = length;
        if (sVar1 <= length) {
          __n = Slice::size(this_00);
        }
        __src = Slice::begin(this_00);
        memcpy((void *)((long)buffer + sVar3),__src,__n);
        sVar3 = sVar3 + __n;
        this_00 = this_00 + 1;
      } while ((this_00 !=
                (this->_vs).super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>.
                _M_impl.super__Vector_impl_data._M_finish) && (length = length - __n, length != 0));
    }
    return sVar3;
  }
  CopyToBuffer();
  do {
    if ((void *)this->_length < buffer) {
      unaff_RBP = 0;
LAB_0010bfcf:
      return unaff_RBP & 0xffffffff;
    }
    unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),1);
    if (buffer == (void *)0x0) goto LAB_0010bfcf;
    __position._M_current =
         (this->_vs).super__Vector_base<raptor::Slice,_std::allocator<raptor::Slice>_>._M_impl.
         super__Vector_impl_data._M_start;
    pvVar2 = (void *)Slice::size(__position._M_current);
    if (buffer < pvVar2) {
      Slice::Slice(&SStack_80,__position._M_current);
      operator-(&SStack_a0,&SStack_80,(size_t)buffer);
      Slice::operator=(__position._M_current,&SStack_a0);
      Slice::~Slice(&SStack_a0);
      Slice::~Slice(&SStack_80);
      this->_length = this->_length - (long)buffer;
      goto LAB_0010bfcf;
    }
    if ((void *)((long)buffer - (long)pvVar2) == (void *)0x0) {
      this->_length = this->_length - (long)buffer;
      std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>::_M_erase(&this->_vs,__position);
      goto LAB_0010bfcf;
    }
    this->_length = this->_length - (long)pvVar2;
    std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>::_M_erase(&this->_vs,__position);
    buffer = (void *)((long)buffer - (long)pvVar2);
  } while( true );
}

Assistant:

size_t SliceBuffer::CopyToBuffer(void* buffer, size_t length) {
    RAPTOR_ASSERT(length <= GetBufferLength());

    auto it = _vs.begin();

    size_t left = length;
    size_t pos = 0;

    while(it != _vs.end() && left != 0) {

        size_t len = RAPTOR_MIN(left, it->size());
        memcpy((uint8_t*)buffer + pos, it->begin(), len);

        left -= len;
        pos += len;

        ++it;
    }

    return pos;
}